

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

_Bool generate_chroma_grain_blocks
                (aom_film_grain_t *params,int **pred_pos_chroma,int *luma_grain_block,
                int *cb_grain_block,int *cr_grain_block,int luma_grain_stride,
                int chroma_block_size_y,int chroma_block_size_x,int chroma_grain_stride,int left_pad
                ,int top_pad,int right_pad,int bottom_pad,int chroma_subsamp_y,int chroma_subsamp_x)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  void *in_R8;
  int in_R9D;
  int l;
  int k;
  int luma_coord_x;
  int luma_coord_y;
  int av_luma;
  int pos;
  int wsum_cr;
  int wsum_cb;
  int j_2;
  int i_2;
  int j_1;
  int i_1;
  int j;
  int i;
  int chroma_grain_block_size;
  int rounding_offset;
  int num_pos_chroma;
  int gauss_sec_shift;
  int bit_depth;
  int local_80;
  int local_7c;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_40;
  
  bVar3 = ('\f' - (char)*(undefined4 *)(in_RDI + 0x278)) + (char)*(undefined4 *)(in_RDI + 0x280);
  local_40 = *(int *)(in_RDI + 0x128) * 2 * (*(int *)(in_RDI + 0x128) + 1);
  if (0 < *(int *)(in_RDI + 0x78)) {
    local_40 = local_40 + 1;
  }
  iVar1 = 1 << ((char)*(undefined4 *)(in_RDI + 0x254) - 1U & 0x1f);
  if ((*(int *)(in_RDI + 0xcc) == 0) && (*(int *)(in_RDI + 0x27c) == 0)) {
    memset(in_RCX,0,(long)(l * av_luma) << 2);
  }
  else {
    init_random_generator(0xe0,*(uint16_t *)(in_RDI + 0x284));
    for (local_4c = 0; local_4c < l; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < luma_coord_x; local_50 = local_50 + 1) {
        iVar2 = get_random_number(0xb);
        *(int *)((long)in_RCX + (long)(local_4c * av_luma + local_50) * 4) =
             gaussian_sequence[iVar2] + ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f);
      }
    }
  }
  if ((*(int *)(in_RDI + 0x120) == 0) && (*(int *)(in_RDI + 0x27c) == 0)) {
    memset(in_R8,0,(long)(l * av_luma) << 2);
  }
  else {
    init_random_generator(0x160,*(uint16_t *)(in_RDI + 0x284));
    for (local_54 = 0; local_54 < l; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < luma_coord_x; local_58 = local_58 + 1) {
        iVar2 = get_random_number(0xb);
        *(int *)((long)in_R8 + (long)(local_54 * av_luma + local_58) * 4) =
             gaussian_sequence[iVar2] + ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f);
      }
    }
  }
  local_5c = j_2;
  do {
    if (l - j <= local_5c) {
      return true;
    }
    for (local_60 = wsum_cr; local_60 < luma_coord_x - j_1; local_60 = local_60 + 1) {
      local_64 = 0;
      local_68 = 0;
      for (local_6c = 0; local_6c < local_40; local_6c = local_6c + 1) {
        if (*(int *)(*(long *)(in_RSI + (long)local_6c * 8) + 8) == 0) {
          iVar5 = *(int *)(in_RDI + 0x18c + (long)local_6c * 4) *
                  *(int *)((long)in_RCX +
                          (long)((local_5c + **(int **)(in_RSI + (long)local_6c * 8)) * av_luma +
                                 local_60 + *(int *)(*(long *)(in_RSI + (long)local_6c * 8) + 4)) *
                          4);
          iVar2 = *(int *)(in_RDI + 0x1f0 + (long)local_6c * 4) *
                  *(int *)((long)in_R8 +
                          (long)((local_5c + **(int **)(in_RSI + (long)local_6c * 8)) * av_luma +
                                 local_60 + *(int *)(*(long *)(in_RSI + (long)local_6c * 8) + 4)) *
                          4);
        }
        else {
          if (*(int *)(*(long *)(in_RSI + (long)local_6c * 8) + 8) != 1) {
            fprintf(_stderr,
                    "Grain synthesis: prediction between two chroma components is not supported!");
            return false;
          }
          local_70 = 0;
          bVar3 = (byte)chroma_grain_block_size;
          bVar4 = (byte)num_pos_chroma;
          iVar5 = (local_60 - wsum_cr << (bVar4 & 0x1f)) + wsum_cr;
          iVar2 = (local_5c - j_2 << (bVar3 & 0x1f)) + j_2;
          for (local_7c = iVar2; local_80 = iVar5, local_7c < iVar2 + chroma_grain_block_size + 1;
              local_7c = local_7c + 1) {
            for (; local_80 < iVar5 + num_pos_chroma + 1; local_80 = local_80 + 1) {
              local_70 = *(int *)(in_RDX + (long)(local_7c * in_R9D + local_80) * 4) + local_70;
            }
          }
          iVar2 = local_70 + ((1 << (bVar3 + bVar4 & 0x1f)) >> 1) >> (bVar3 + bVar4 & 0x1f);
          iVar5 = *(int *)(in_RDI + 0x18c + (long)local_6c * 4) * iVar2;
          iVar2 = *(int *)(in_RDI + 0x1f0 + (long)local_6c * 4) * iVar2;
        }
        local_64 = local_64 + iVar5;
        local_68 = local_68 + iVar2;
      }
      if ((*(int *)(in_RDI + 0xcc) != 0) || (*(int *)(in_RDI + 0x27c) != 0)) {
        iVar2 = clamp(*(int *)((long)in_RCX + (long)(local_5c * av_luma + local_60) * 4) +
                      (local_64 + iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x254) & 0x1f)),grain_min
                      ,grain_max);
        *(int *)((long)in_RCX + (long)(local_5c * av_luma + local_60) * 4) = iVar2;
      }
      if ((*(int *)(in_RDI + 0x120) != 0) || (*(int *)(in_RDI + 0x27c) != 0)) {
        iVar2 = clamp(*(int *)((long)in_R8 + (long)(local_5c * av_luma + local_60) * 4) +
                      (local_68 + iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x254) & 0x1f)),grain_min
                      ,grain_max);
        *(int *)((long)in_R8 + (long)(local_5c * av_luma + local_60) * 4) = iVar2;
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

static bool generate_chroma_grain_blocks(
    const aom_film_grain_t *params, int **pred_pos_chroma,
    int *luma_grain_block, int *cb_grain_block, int *cr_grain_block,
    int luma_grain_stride, int chroma_block_size_y, int chroma_block_size_x,
    int chroma_grain_stride, int left_pad, int top_pad, int right_pad,
    int bottom_pad, int chroma_subsamp_y, int chroma_subsamp_x) {
  int bit_depth = params->bit_depth;
  int gauss_sec_shift = 12 - bit_depth + params->grain_scale_shift;

  int num_pos_chroma = 2 * params->ar_coeff_lag * (params->ar_coeff_lag + 1);
  if (params->num_y_points > 0) ++num_pos_chroma;
  int rounding_offset = (1 << (params->ar_coeff_shift - 1));
  int chroma_grain_block_size = chroma_block_size_y * chroma_grain_stride;

  if (params->num_cb_points || params->chroma_scaling_from_luma) {
    init_random_generator(7 << 5, params->random_seed);

    for (int i = 0; i < chroma_block_size_y; i++)
      for (int j = 0; j < chroma_block_size_x; j++)
        cb_grain_block[i * chroma_grain_stride + j] =
            (gaussian_sequence[get_random_number(gauss_bits)] +
             ((1 << gauss_sec_shift) >> 1)) >>
            gauss_sec_shift;
  } else {
    memset(cb_grain_block, 0,
           sizeof(*cb_grain_block) * chroma_grain_block_size);
  }

  if (params->num_cr_points || params->chroma_scaling_from_luma) {
    init_random_generator(11 << 5, params->random_seed);

    for (int i = 0; i < chroma_block_size_y; i++)
      for (int j = 0; j < chroma_block_size_x; j++)
        cr_grain_block[i * chroma_grain_stride + j] =
            (gaussian_sequence[get_random_number(gauss_bits)] +
             ((1 << gauss_sec_shift) >> 1)) >>
            gauss_sec_shift;
  } else {
    memset(cr_grain_block, 0,
           sizeof(*cr_grain_block) * chroma_grain_block_size);
  }

  for (int i = top_pad; i < chroma_block_size_y - bottom_pad; i++)
    for (int j = left_pad; j < chroma_block_size_x - right_pad; j++) {
      int wsum_cb = 0;
      int wsum_cr = 0;
      for (int pos = 0; pos < num_pos_chroma; pos++) {
        if (pred_pos_chroma[pos][2] == 0) {
          wsum_cb = wsum_cb + params->ar_coeffs_cb[pos] *
                                  cb_grain_block[(i + pred_pos_chroma[pos][0]) *
                                                     chroma_grain_stride +
                                                 j + pred_pos_chroma[pos][1]];
          wsum_cr = wsum_cr + params->ar_coeffs_cr[pos] *
                                  cr_grain_block[(i + pred_pos_chroma[pos][0]) *
                                                     chroma_grain_stride +
                                                 j + pred_pos_chroma[pos][1]];
        } else if (pred_pos_chroma[pos][2] == 1) {
          int av_luma = 0;
          int luma_coord_y = ((i - top_pad) << chroma_subsamp_y) + top_pad;
          int luma_coord_x = ((j - left_pad) << chroma_subsamp_x) + left_pad;

          for (int k = luma_coord_y; k < luma_coord_y + chroma_subsamp_y + 1;
               k++)
            for (int l = luma_coord_x; l < luma_coord_x + chroma_subsamp_x + 1;
                 l++)
              av_luma += luma_grain_block[k * luma_grain_stride + l];

          av_luma =
              (av_luma + ((1 << (chroma_subsamp_y + chroma_subsamp_x)) >> 1)) >>
              (chroma_subsamp_y + chroma_subsamp_x);

          wsum_cb = wsum_cb + params->ar_coeffs_cb[pos] * av_luma;
          wsum_cr = wsum_cr + params->ar_coeffs_cr[pos] * av_luma;
        } else {
          fprintf(
              stderr,
              "Grain synthesis: prediction between two chroma components is "
              "not supported!");
          return false;
        }
      }
      if (params->num_cb_points || params->chroma_scaling_from_luma)
        cb_grain_block[i * chroma_grain_stride + j] =
            clamp(cb_grain_block[i * chroma_grain_stride + j] +
                      ((wsum_cb + rounding_offset) >> params->ar_coeff_shift),
                  grain_min, grain_max);
      if (params->num_cr_points || params->chroma_scaling_from_luma)
        cr_grain_block[i * chroma_grain_stride + j] =
            clamp(cr_grain_block[i * chroma_grain_stride + j] +
                      ((wsum_cr + rounding_offset) >> params->ar_coeff_shift),
                  grain_min, grain_max);
    }
  return true;
}